

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::StoreMatches(cmMakefile *this,RegularExpression *re)

{
  string_view value;
  ulong uVar1;
  long lVar2;
  string_view local_80;
  char local_6e [8];
  char nMatches [2];
  string *var;
  string *local_28;
  string *m;
  int i;
  char highest;
  RegularExpression *re_local;
  cmMakefile *this_local;
  
  m._7_1_ = '\0';
  _i = re;
  re_local = (RegularExpression *)this;
  for (m._0_4_ = 0; (int)m < 10; m._0_4_ = (int)m + 1) {
    cmsys::RegularExpression::match_abi_cxx11_((string *)&var,_i,(int)m);
    local_28 = (string *)&var;
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      lVar2 = (long)(int)m;
      value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_28);
      AddDefinition(this,matchVariables_abi_cxx11_ + lVar2,value);
      MarkVariableAsUsed(this,matchVariables_abi_cxx11_ + lVar2);
      m._7_1_ = (char)(int)m + '0';
    }
    std::__cxx11::string::~string((string *)&var);
  }
  local_6e[0] = m._7_1_;
  local_6e[1] = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,local_6e);
  AddDefinition(this,&nMatchesVariable_abi_cxx11_,local_80);
  MarkVariableAsUsed(this,&nMatchesVariable_abi_cxx11_);
  return;
}

Assistant:

void cmMakefile::StoreMatches(cmsys::RegularExpression& re)
{
  char highest = 0;
  for (int i = 0; i < 10; i++) {
    std::string const& m = re.match(i);
    if (!m.empty()) {
      std::string const& var = matchVariables[i];
      this->AddDefinition(var, m);
      this->MarkVariableAsUsed(var);
      highest = static_cast<char>('0' + i);
    }
  }
  char nMatches[] = { highest, '\0' };
  this->AddDefinition(nMatchesVariable, nMatches);
  this->MarkVariableAsUsed(nMatchesVariable);
}